

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall QSystemTrayIconSys::paintEvent(QSystemTrayIconSys *this,QPaintEvent *param_1)

{
  QSize QVar1;
  long in_FS_OFFSET;
  undefined1 local_40 [8];
  QPainter painter;
  undefined8 local_30;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = QRect::size((QRect *)(*(long *)(this + 0x20) + 0x14));
  local_28 = QVar1.wd.m_i.m_i + -1;
  local_30 = 0;
  local_24 = QVar1.ht.m_i.m_i + -1;
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter,(QPaintDevice *)(this + 0x10));
  QSystemTrayIcon::icon((QSystemTrayIcon *)local_40);
  QIcon::paint((QSystemTrayIcon *)local_40,&painter,&local_30,0x84,0,1);
  QIcon::~QIcon((QIcon *)local_40);
  QPainter::~QPainter(&painter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconSys::paintEvent(QPaintEvent *)
{
    const QRect rect(QPoint(0, 0), geometry().size());
    QPainter painter(this);

    q->icon().paint(&painter, rect);
}